

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall randomx::Instruction::h_IROL_R(Instruction *this,ostream *os)

{
  uint32_t uVar1;
  ostream *poVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  ostream *in_RSI;
  long in_RDI;
  int srcIndex;
  int dstIndex;
  
  uVar4 = (uint)*(byte *)(in_RDI + 1) % 8;
  uVar5 = (uint)*(byte *)(in_RDI + 2) % 8;
  if (uVar4 == uVar5) {
    poVar2 = std::operator<<(in_RSI,"r");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4);
    poVar2 = std::operator<<(poVar2,", ");
    uVar1 = getImm32((Instruction *)0x110b4a);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,uVar1 & 0x3f);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<(in_RSI,"r");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4);
    poVar2 = std::operator<<(poVar2,", r");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,uVar5);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Instruction::h_IROL_R(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		if (dstIndex != srcIndex) {
			os << "r" << dstIndex << ", r" << srcIndex << std::endl;
		}
		else {
			os << "r" << dstIndex << ", " << (getImm32() & 63) << std::endl;
		}
	}